

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::MethodDescriptorProto::ByteSizeLong(MethodDescriptorProto *this)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  
  uVar1 = *(uint *)&this->field_0;
  sVar3 = (size_t)((((uVar1 & 0x30) >> 4) - ((uVar1 & 0x30) >> 5)) * 2);
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar2 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
                        );
      sVar3 = sVar3 + sVar2 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar2 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.input_type_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar3 = sVar3 + sVar2 + 1;
    }
    if ((uVar1 & 4) != 0) {
      sVar2 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.output_type_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar3 = sVar3 + sVar2 + 1;
    }
    if ((uVar1 & 8) != 0) {
      sVar2 = internal::WireFormatLite::MessageSize<google::protobuf::MethodOptions>
                        ((this->field_0)._impl_.options_);
      sVar3 = sVar3 + sVar2 + 1;
    }
  }
  sVar3 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar3,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t MethodDescriptorProto::ByteSizeLong() const {
  const MethodDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.MethodDescriptorProto)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += ::absl::popcount(0x00000030u & cached_has_bits) * 2;
  if ((cached_has_bits & 0x0000000fu) != 0) {
    // optional string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name());
    }
    // optional string input_type = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_input_type());
    }
    // optional string output_type = 3;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_output_type());
    }
    // optional .google.protobuf.MethodOptions options = 4;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}